

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBuildNameCommand.h
# Opt level: O2

void __thiscall cmBuildNameCommand::~cmBuildNameCommand(cmBuildNameCommand *this)

{
  cmCommand::~cmCommand(&this->super_cmCommand);
  operator_delete(this,0x30);
  return;
}

Assistant:

cmCommand* Clone() override { return new cmBuildNameCommand; }